

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

int tcsicmp_ascii(tchar_t *a,tchar_t *b)

{
  byte bVar1;
  byte bVar2;
  int local_30;
  int local_2c;
  int cb;
  int ca;
  tchar_t *b_local;
  tchar_t *a_local;
  int local_10;
  int local_c;
  
  _cb = (byte *)b;
  b_local = a;
  do {
    bVar2 = *b_local;
    bVar1 = bVar2 ^ *_cb;
    if ((bVar1 != 0) &&
       (((bVar2 = bVar2 & 0xdf, (bVar1 & 0xdf) != 0 || ((char)bVar2 < 'A')) || ('Z' < (char)bVar2)))
       ) {
      local_2c = (int)*b_local;
      local_30 = (int)(char)*_cb;
LAB_001360f1:
      local_c = local_2c;
      if ((0x60 < local_2c) && (local_2c < 0x7b)) {
        local_c = local_2c + -0x20;
      }
      local_10 = local_30;
      if ((0x60 < local_30) && (local_30 < 0x7b)) {
        local_10 = local_30 + -0x20;
      }
      return local_c - local_10;
    }
    if (bVar2 == 0) {
      return 0;
    }
    bVar2 = b_local[1];
    bVar1 = bVar2 ^ _cb[1];
    if ((bVar1 != 0) &&
       (((bVar2 = bVar2 & 0xdf, (bVar1 & 0xdf) != 0 || ((char)bVar2 < 'A')) || ('Z' < (char)bVar2)))
       ) {
      local_2c = (int)b_local[1];
      local_30 = (int)(char)_cb[1];
      goto LAB_001360f1;
    }
    if (bVar2 == 0) {
      return 0;
    }
    bVar2 = b_local[2];
    bVar1 = bVar2 ^ _cb[2];
    if ((bVar1 != 0) &&
       (((bVar2 = bVar2 & 0xdf, (bVar1 & 0xdf) != 0 || ((char)bVar2 < 'A')) || ('Z' < (char)bVar2)))
       ) {
      local_2c = (int)b_local[2];
      local_30 = (int)(char)_cb[2];
      goto LAB_001360f1;
    }
    if (bVar2 == 0) {
      return 0;
    }
    bVar2 = b_local[3];
    bVar1 = bVar2 ^ _cb[3];
    if ((bVar1 != 0) &&
       (((bVar2 = bVar2 & 0xdf, (bVar1 & 0xdf) != 0 || ((char)bVar2 < 'A')) || ('Z' < (char)bVar2)))
       ) {
      local_2c = (int)b_local[3];
      local_30 = (int)(char)_cb[3];
      goto LAB_001360f1;
    }
    if (bVar2 == 0) {
      return 0;
    }
    b_local = b_local + 4;
    _cb = _cb + 4;
  } while( true );
}

Assistant:

int tcsicmp_ascii(const tchar_t* a,const tchar_t* b)
{
    int ca,cb;
    for (;;a+=4,b+=4)
    {
        icmp_ascii(a,b,0)
        icmp_ascii(a,b,1)
        icmp_ascii(a,b,2)
        icmp_ascii(a,b,3)
    }
    return ascii_upper(ca)-ascii_upper(cb);
}